

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  undefined2 uVar1;
  char *__dest;
  ulong uVar2;
  ushort uVar3;
  int iVar4;
  u32 uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  double dVar9;
  StrAccum local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = sqlite3VdbeMemClearAndResize(pMem,0x20);
  if (iVar4 == 0) {
    __dest = pMem->z;
    if ((pMem->flags & 4) == 0) {
      local_58.db = (sqlite3 *)0x0;
      local_58.nAlloc = 0x20;
      local_58.accError = '\0';
      local_58.printfFlags = '\0';
      local_58.mxAlloc = 0;
      local_58.nChar = 0;
      if ((pMem->flags & 0x20) == 0) {
        dVar9 = (pMem->u).r;
      }
      else {
        dVar9 = (double)(pMem->u).i;
      }
      local_58.zText = __dest;
      sqlite3_str_appendf(&local_58,"%!.15g",dVar9);
      __dest[local_58.nChar] = '\0';
      uVar5 = local_58.nChar;
    }
    else {
      uVar2 = (pMem->u).i;
      uVar6 = -uVar2;
      if (0 < (long)uVar2) {
        uVar6 = uVar2;
      }
      local_58.mxAlloc._0_2_ = (ushort)(byte)local_58.mxAlloc;
      lVar7 = 0x14;
      lVar8 = 0x1400000000;
      iVar4 = 0x13;
      while( true ) {
        *(byte *)((long)&local_58.db + lVar7) = (byte)(uVar6 % 10) | 0x30;
        if (uVar6 < 10) break;
        lVar7 = lVar7 + -1;
        lVar8 = lVar8 + -0x100000000;
        iVar4 = iVar4 + -1;
        uVar6 = uVar6 / 10;
      }
      if ((long)uVar2 < 0) {
        lVar8 = (long)iVar4;
        *(undefined1 *)((long)&local_58.db + lVar8) = 0x2d;
      }
      else {
        lVar8 = lVar8 >> 0x20;
        iVar4 = (int)lVar7;
      }
      memcpy(__dest,(void *)((long)&local_58.db + lVar8),0x16 - lVar8);
      uVar5 = 0x15 - iVar4;
    }
    pMem->n = uVar5;
    pMem->enc = '\x01';
    uVar1 = pMem->flags;
    uVar3 = uVar1 & 0xffd3;
    if (bForce == '\0') {
      uVar3 = uVar1;
    }
    pMem->flags = uVar3 | 0x202;
    sqlite3VdbeChangeEncoding(pMem,(uint)enc);
    iVar4 = 0;
  }
  else {
    pMem->enc = '\0';
    iVar4 = 7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  assert( pMem->n==(int)sqlite3Strlen30NN(pMem->z) );
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}